

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O3

void __thiscall absl::lts_20240722::FlagSaver::~FlagSaver(FlagSaver *this)

{
  pointer puVar1;
  vector<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>,_std::allocator<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>_>_>
  *__range3;
  FlagSaverImpl *this_00;
  unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>
  *flag_state;
  pointer puVar2;
  
  this_00 = this->impl_;
  if (this_00 == (FlagSaverImpl *)0x0) {
    return;
  }
  puVar2 = (this_00->backup_registry_).
           super__Vector_base<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>,_std::allocator<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this_00->backup_registry_).
           super__Vector_base<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>,_std::allocator<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    do {
      (**(code **)(*(long *)(puVar2->_M_t).
                            super___uniq_ptr_impl<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_absl::lts_20240722::flags_internal::FlagStateInterface_*,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>
                            .
                            super__Head_base<0UL,_absl::lts_20240722::flags_internal::FlagStateInterface_*,_false>
                            ._M_head_impl + 0x10))();
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
    this_00 = this->impl_;
    if (this_00 == (FlagSaverImpl *)0x0) {
      this_00 = (FlagSaverImpl *)0x0;
      goto LAB_001077ec;
    }
  }
  std::
  vector<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>,_std::allocator<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>_>_>
  ::~vector(&this_00->backup_registry_);
LAB_001077ec:
  operator_delete(this_00,0x18);
  return;
}

Assistant:

FlagSaver::~FlagSaver() {
  if (!impl_) return;

  impl_->RestoreToRegistry();
  delete impl_;
}